

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UnconditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::UnconditionalBranchDirectiveSyntax_const&>
          (BumpAllocator *this,UnconditionalBranchDirectiveSyntax *args)

{
  UnconditionalBranchDirectiveSyntax *pUVar1;
  UnconditionalBranchDirectiveSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pUVar1 = (UnconditionalBranchDirectiveSyntax *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::UnconditionalBranchDirectiveSyntax::UnconditionalBranchDirectiveSyntax
            (in_RSI,pUVar1);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }